

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodea_io.c
# Opt level: O2

int CVodeGetAdjDataPointPolynomial(void *cvode_mem,int which,sunrealtype *t,int *order,N_Vector y)

{
  sunrealtype *psVar1;
  undefined8 *puVar2;
  int line;
  int error_code;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x15;
    line = 0x2e3;
  }
  else if (*(int *)((long)cvode_mem + 0xa78) == 0) {
    msgfmt = "Illegal attempt to call before calling CVodeAdjMalloc.";
    error_code = -0x65;
    line = 0x2eb;
  }
  else {
    if (*(int *)(*(long *)((long)cvode_mem + 0xa70) + 0x88) == 2) {
      psVar1 = *(sunrealtype **)
                (*(long *)(*(long *)((long)cvode_mem + 0xa70) + 0x78) + (long)which * 8);
      *t = *psVar1;
      puVar2 = (undefined8 *)psVar1[1];
      if (y != (N_Vector)0x0) {
        N_VScale(0x3ff0000000000000,*puVar2,y);
      }
      *order = *(int *)(puVar2 + 2);
      return 0;
    }
    msgfmt = "This function cannot be called for the specified interp type.";
    error_code = -0x16;
    line = 0x2f4;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,line,"CVodeGetAdjDataPointPolynomial",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodea_io.c"
                 ,msgfmt);
  return error_code;
}

Assistant:

int CVodeGetAdjDataPointPolynomial(void* cvode_mem, int which, sunrealtype* t,
                                   int* order, N_Vector y)
{
  CVodeMem cv_mem;
  CVadjMem ca_mem;
  CVdtpntMem* dt_mem;
  CVpolynomialDataMem content;

  /* Check if cvode_mem exists */
  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* Was ASA initialized? */
  if (cv_mem->cv_adjMallocDone == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_ADJ, __LINE__, __func__, __FILE__, MSGCV_NO_ADJ);
    return (CV_NO_ADJ);
  }
  ca_mem = cv_mem->cv_adj_mem;

  dt_mem = ca_mem->dt_mem;

  if (ca_mem->ca_IMtype != CV_POLYNOMIAL)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_WRONG_INTERP);
    return (CV_ILL_INPUT);
  }

  *t = dt_mem[which]->t;

  content = (CVpolynomialDataMem)(dt_mem[which]->content);

  if (y != NULL) { N_VScale(ONE, content->y, y); }

  *order = content->order;

  return (CV_SUCCESS);
}